

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseapp.hpp
# Opt level: O2

void __thiscall piksel::BaseApp::BaseApp(BaseApp *this,int width,int height)

{
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"piksel",&local_41);
  BaseApp(this,width,height,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

BaseApp(int width, int height) : BaseApp(width, height, "piksel") {
    }